

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.cpp
# Opt level: O2

ProKey * __thiscall ProFile::getHashStr(ProKey *__return_storage_ptr__,ProFile *this,ushort **tPtr)

{
  ushort uVar1;
  uint hash;
  uint *puVar2;
  char16_t *pcVar3;
  
  puVar2 = (uint *)*tPtr;
  *tPtr = (ushort *)((long)puVar2 + 2);
  hash = *puVar2;
  *tPtr = (ushort *)((long)puVar2 + 6);
  uVar1 = (ushort)puVar2[1];
  *(undefined8 *)&(__return_storage_ptr__->super_ProString).m_file = 0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->super_ProString).m_hash = 0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->super_ProString).m_string.d.size = -0x5555555555555556;
  (__return_storage_ptr__->super_ProString).m_offset = -0x55555556;
  (__return_storage_ptr__->super_ProString).m_length = -0x55555556;
  (__return_storage_ptr__->super_ProString).m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->super_ProString).m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  pcVar3 = (this->m_proitems).d.ptr;
  if (pcVar3 == (char16_t *)0x0) {
    pcVar3 = (char16_t *)&QString::_empty;
  }
  ProKey::ProKey(__return_storage_ptr__,&this->m_proitems,
                 (int)((ulong)((long)puVar2 + (6 - (long)pcVar3)) >> 1),(uint)uVar1,hash);
  *tPtr = (ushort *)((long)*tPtr + (ulong)((uint)uVar1 + (uint)uVar1));
  return __return_storage_ptr__;
}

Assistant:

ProKey ProFile::getHashStr(const ushort *&tPtr)
{
    uint hash = *tPtr++;
    hash |= (uint)*tPtr++ << 16;
    uint len = *tPtr++;
    ProKey ret(items(), tPtr - tokPtr(), len, hash);
    tPtr += len;
    return ret;
}